

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O0

int gost_mgm128_finish(mgm128_context *ctx,uchar *tag,size_t len)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  code *pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  int bl;
  void *key;
  mul128_f mul_gf;
  block128_f block;
  uint64_t clen;
  uint64_t alen;
  grasshopper_w128_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar8;
  undefined4 local_4;
  
  lVar1 = *(long *)(in_RDI + 0x50);
  uVar6 = lVar1 << 3;
  lVar2 = *(long *)(in_RDI + 0x58);
  uVar7 = lVar2 << 3;
  pcVar3 = *(code **)(in_RDI + 0xa8);
  pcVar4 = *(code **)(in_RDI + 0xb0);
  uVar5 = *(undefined8 *)(in_RDI + 0xc0);
  iVar8 = *(int *)(in_RDI + 0xb8);
  if ((*(int *)(in_RDI + 0xa0) != 0) || (*(int *)(in_RDI + 0xa4) != 0)) {
    memset((void *)(in_RDI + 0x60 + (ulong)*(uint *)(in_RDI + 0xa4) +
                   (ulong)*(uint *)(in_RDI + 0xa0)),0,
           (ulong)(uint)(iVar8 - (*(int *)(in_RDI + 0xa4) + *(int *)(in_RDI + 0xa0))));
    (*pcVar3)(in_RDI + 0x20,in_RDI + 0x40,uVar5);
    (*pcVar4)(in_RDI + 0x70,in_RDI + 0x40,in_RDI + 0x60);
    grasshopper_plus128((grasshopper_w128_t *)CONCAT44(iVar8,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffa8,(grasshopper_w128_t *)0x11cf5b);
    inc_counter((uchar *)(in_RDI + 0x20),(long)(iVar8 / 2));
  }
  uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
          (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
          (uVar6 & 0xff00) << 0x28 | lVar1 << 0x3b;
  uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
          (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
          (uVar7 & 0xff00) << 0x28 | lVar2 << 0x3b;
  if (iVar8 == 0x10) {
    *(ulong *)(in_RDI + 0x50) = uVar6;
    *(ulong *)(in_RDI + 0x58) = uVar7;
  }
  else {
    *(ulong *)(in_RDI + 0x50) = uVar6 >> 0x20 | uVar7;
    *(undefined8 *)(in_RDI + 0x58) = 0;
  }
  (*pcVar3)(in_RDI + 0x20,in_RDI + 0x40,uVar5);
  (*pcVar4)(in_RDI + 0x70,in_RDI + 0x40,in_RDI + 0x50);
  grasshopper_plus128((grasshopper_w128_t *)CONCAT44(iVar8,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8,(grasshopper_w128_t *)0x11d179);
  (*pcVar3)(in_RDI + 0x80,in_RDI + 0x90,uVar5);
  if ((in_RSI == (void *)0x0) || (0x10 < in_RDX)) {
    local_4 = -1;
  }
  else {
    local_4 = CRYPTO_memcmp((void *)(in_RDI + 0x90),in_RSI,in_RDX);
  }
  return local_4;
}

Assistant:

int gost_mgm128_finish(mgm128_context *ctx, const unsigned char *tag,
                         size_t len)
{
    uint64_t alen = ctx->len.u[0] << 3;
    uint64_t clen = ctx->len.u[1] << 3;
    block128_f block = ctx->block;
    mul128_f mul_gf = ctx->mul_gf;
    void *key = ctx->key;
    int bl = ctx->blocklen;

    if (ctx->mres || ctx->ares) {
        /* First call to encrypt finalizes AAD/ENC */
        memset(ctx->ACi.c + ctx->ares + ctx->mres, 0, bl - (ctx->ares + ctx->mres));
        (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
        mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) [A_i or C_i]
        grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
        inc_counter(ctx->Zi.c, bl / 2);                         // Z_{i+1} = incr_l(Z_i)
    }

#ifdef L_ENDIAN
    alen = BSWAP64(alen);
    clen = BSWAP64(clen);
#endif
    if (bl == 16) {
        ctx->len.u[0] = alen;
        ctx->len.u[1] = clen;
    } else {
#ifdef L_ENDIAN
        ctx->len.u[0] = (alen >> 32) | clen;
#else
        ctx->len.u[0] = (alen << 32) | clen;
#endif
        ctx->len.u[1] = 0;
    }

    (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
    mul_gf(ctx->mul.u, ctx->Hi.u, ctx->len.u);              // H_i (x) (len(A) || len(C))
    grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
    (*block) (ctx->sum.c, ctx->tag.c, key);                 // E_K(sum)

    if (tag && len <= sizeof(ctx->tag))
        return CRYPTO_memcmp(ctx->tag.c, tag, len);         // MSB_S(E_K(sum))
    else
        return -1;
}